

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkFraig(Abc_Ntk_t *pNtk,void *pParams,int fAllNodes,int fExdc)

{
  ulong uVar1;
  char *pcVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  Fraig_Man_t *p;
  stmm_table *table;
  Abc_Obj_t *pAVar6;
  Vec_Ptr_t *vNodeReprs;
  Abc_Ntk_t *pNtkNew;
  int *__s;
  ProgressBar *p_00;
  Vec_Ptr_t *pVVar7;
  Abc_Ntk_t *pAVar8;
  long lVar9;
  Abc_Obj_t *pRepr;
  char **local_50;
  Fraig_Man_t *local_48;
  void **local_40;
  char *local_38;
  
  if (fExdc != 0) {
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) goto LAB_002c6f05;
    puts("Warning: Networks has no EXDC.");
  }
  fExdc = 0;
LAB_002c6f05:
  p = (Fraig_Man_t *)Abc_NtkToFraig(pNtk,pParams,fAllNodes,fExdc);
  if (*(int *)((long)pParams + 0x24) != 0) {
    Fraig_ManProveMiter(p);
  }
  if (fExdc == 0) {
    pNtkNew = Abc_NtkFromFraig(p,pNtk);
  }
  else {
    local_48 = p;
    table = stmm_init_table(stmm_ptrcmp,stmm_ptrhash);
    pAVar6 = Abc_AigConst1(pNtk);
    iVar4 = stmm_find_or_add(table,(char *)((ulong)(pAVar6->field_6).pTemp & 0xfffffffffffffffe),
                             &local_50);
    if (iVar4 == 0) {
      *local_50 = (char *)pAVar6;
    }
    pVVar7 = pNtk->vCis;
    if (0 < pVVar7->nSize) {
      lVar9 = 0;
      do {
        pcVar2 = (char *)pVVar7->pArray[lVar9];
        iVar4 = stmm_find_or_add(table,(char *)(*(ulong *)(pcVar2 + 0x40) & 0xfffffffffffffffe),
                                 &local_50);
        if (iVar4 == 0) {
          *local_50 = pcVar2;
        }
        lVar9 = lVar9 + 1;
        pVVar7 = pNtk->vCis;
      } while (lVar9 < pVVar7->nSize);
    }
    pVVar7 = pNtk->vObjs;
    iVar4 = pVVar7->nSize;
    if (0 < iVar4) {
      lVar9 = 0;
      do {
        pcVar2 = (char *)pVVar7->pArray[lVar9];
        if (((pcVar2 != (char *)0x0) && ((*(uint *)(pcVar2 + 0x14) & 0xf) == 7)) &&
           (*(ulong *)(pcVar2 + 0x40) != 0)) {
          iVar4 = stmm_find_or_add(table,(char *)(*(ulong *)(pcVar2 + 0x40) & 0xfffffffffffffffe),
                                   &local_50);
          if ((iVar4 == 0) || (*(uint *)(pcVar2 + 0x14) >> 0xc < *(uint *)(*local_50 + 0x14) >> 0xc)
             ) {
            *local_50 = pcVar2;
          }
        }
        lVar9 = lVar9 + 1;
        pVVar7 = pNtk->vObjs;
        iVar4 = pVVar7->nSize;
      } while (lVar9 < iVar4);
    }
    vNodeReprs = (Vec_Ptr_t *)malloc(0x10);
    iVar5 = 8;
    if (6 < iVar4 - 1U) {
      iVar5 = iVar4;
    }
    vNodeReprs->nCap = iVar5;
    if (iVar5 == 0) {
      local_40 = (void **)0x0;
    }
    else {
      local_40 = (void **)malloc((long)iVar5 << 3);
    }
    vNodeReprs->pArray = local_40;
    vNodeReprs->nSize = iVar4;
    memset(local_40,0,(long)iVar4 << 3);
    if (0 < pVVar7->nSize) {
      lVar9 = 0;
      do {
        pcVar2 = (char *)pVVar7->pArray[lVar9];
        if (((pcVar2 != (char *)0x0) && ((*(uint *)(pcVar2 + 0x14) & 0xf) == 7)) &&
           (*(ulong *)(pcVar2 + 0x40) != 0)) {
          iVar5 = stmm_lookup(table,(char *)(*(ulong *)(pcVar2 + 0x40) & 0xfffffffffffffffe),
                              &local_38);
          if (iVar5 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFraig.c"
                          ,0x19a,"Abc_Ntk_t *Abc_NtkFromFraig2(Fraig_Man_t *, Abc_Ntk_t *)");
          }
          if (pcVar2 != local_38) {
            iVar5 = *(int *)(pcVar2 + 0x10);
            if (((long)iVar5 < 0) || (iVar4 <= iVar5)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
            }
            local_40[iVar5] = local_38;
          }
        }
        lVar9 = lVar9 + 1;
        pVVar7 = pNtk->vObjs;
      } while (lVar9 < pVVar7->nSize);
    }
    stmm_free_table(table);
    pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    Abc_AigSetNodePhases(pNtk);
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar4 = pNtk->vObjs->nSize;
      uVar1 = (long)iVar4 + 500;
      iVar5 = (int)uVar1;
      if ((pNtk->vTravIds).nCap < iVar5) {
        __s = (int *)malloc(uVar1 * 4);
        (pNtk->vTravIds).pArray = __s;
        if (__s == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = iVar5;
      }
      else {
        __s = (int *)0x0;
      }
      if (-500 < iVar4) {
        memset(__s,0,(uVar1 & 0xffffffff) << 2);
      }
      (pNtk->vTravIds).nSize = iVar5;
    }
    iVar4 = pNtk->nTravIds;
    pNtk->nTravIds = iVar4 + 1;
    if (0x3ffffffe < iVar4) {
      __assert_fail("p->nTravIds < (1<<30)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                    ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
    }
    p_00 = Extra_ProgressBarStart(_stdout,pNtk->vCos->nSize);
    pVVar7 = pNtk->vCos;
    if (0 < pVVar7->nSize) {
      lVar9 = 0;
      do {
        plVar3 = (long *)pVVar7->pArray[lVar9];
        if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= lVar9)) {
          Extra_ProgressBarUpdate_int(p_00,(int)lVar9,(char *)0x0);
        }
        Abc_NtkFromFraig2_rec
                  (pNtkNew,*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8)
                   ,vNodeReprs);
        lVar9 = lVar9 + 1;
        pVVar7 = pNtk->vCos;
      } while (lVar9 < pVVar7->nSize);
    }
    Extra_ProgressBarStop(p_00);
    if (vNodeReprs->pArray != (void **)0x0) {
      free(vNodeReprs->pArray);
    }
    free(vNodeReprs);
    Abc_NtkFinalize(pNtk,pNtkNew);
    p = local_48;
  }
  Fraig_ManFree(p);
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    pAVar8 = Abc_NtkDup(pNtk->pExdc);
    pNtkNew->pExdc = pAVar8;
  }
  iVar4 = Abc_NtkCheck(pNtkNew);
  if (iVar4 == 0) {
    puts("Abc_NtkFraig: The network check has failed.");
    Abc_NtkDelete(pNtkNew);
    pNtkNew = (Abc_Ntk_t *)0x0;
  }
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkFraig( Abc_Ntk_t * pNtk, void * pParams, int fAllNodes, int fExdc )
{
    Fraig_Params_t * pPars = (Fraig_Params_t *)pParams;
    Abc_Ntk_t * pNtkNew;
    Fraig_Man_t * pMan; 
    // check if EXDC is present
    if ( fExdc && pNtk->pExdc == NULL )
        fExdc = 0, printf( "Warning: Networks has no EXDC.\n" );
    // perform fraiging
    pMan = (Fraig_Man_t *)Abc_NtkToFraig( pNtk, pParams, fAllNodes, fExdc ); 
    // add algebraic choices
//    if ( pPars->fChoicing )
//        Fraig_ManAddChoices( pMan, 0, 6 );
    // prove the miter if asked to
    if ( pPars->fTryProve )
        Fraig_ManProveMiter( pMan );
    // reconstruct FRAIG in the new network
    if ( fExdc ) 
        pNtkNew = Abc_NtkFromFraig2( pMan, pNtk );
    else
        pNtkNew = Abc_NtkFromFraig( pMan, pNtk );
    Fraig_ManFree( pMan );
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkFraig: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}